

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O0

int compare_dates(void *a,void *b)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int bv;
  int byear;
  int bmonth;
  int bday;
  int av;
  int ayear;
  int amonth;
  int aday;
  char *p;
  FLevelStatistics *B;
  FLevelStatistics *A;
  void *b_local;
  void *a_local;
  
  p = (char *)b;
  B = (FLevelStatistics *)a;
  A = (FLevelStatistics *)b;
  b_local = a;
  lVar1 = strtol((char *)((long)a + 0x22),(char **)&amonth,10);
  lVar2 = strtol(_amonth + 1,(char **)&amonth,10);
  lVar3 = strtol(_amonth + 1,(char **)&amonth,10);
  lVar4 = strtol(p + 0x22,(char **)&amonth,10);
  lVar5 = strtol(_amonth + 1,(char **)&amonth,10);
  lVar6 = strtol(_amonth + 1,(char **)&amonth,10);
  return ((int)lVar1 + (int)lVar2 * 100 + (int)lVar3 * 2000) -
         ((int)lVar4 + (int)lVar5 * 100 + (int)lVar6 * 2000);
}

Assistant:

int compare_dates(const void *a, const void *b)
{
	FLevelStatistics *A = (FLevelStatistics*)a;
	FLevelStatistics *B = (FLevelStatistics*)b;
	char *p;

	int aday = strtol(A->name, &p, 10);
	int amonth = strtol(p+1, &p, 10);
	int ayear = strtol(p+1, &p, 10);
	int av = aday + 100 * amonth + 2000*ayear;

	int bday = strtol(B->name, &p, 10);
	int bmonth = strtol(p+1, &p, 10);
	int byear = strtol(p+1, &p, 10);
	int bv = bday + 100 * bmonth + 2000*byear;

	return av-bv;
}